

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

void borg_sleep_kill(wchar_t i)

{
  borg_kill *pbVar1;
  char *pcVar2;
  
  pbVar1 = borg_kills;
  if (borg_kills[i].r_idx != 0) {
    pcVar2 = borg_race_name((uint)borg_kills[i].r_idx);
    pcVar2 = format("# Noting sleep on a monster \'%s\' at (%d,%d)",pcVar2,
                    (ulong)(uint)pbVar1[i].pos.y,(ulong)(uint)pbVar1[i].pos.x);
    borg_note(pcVar2);
    pbVar1[i].awake = false;
    borg.goal.type = 0;
    borg_danger_wipe = true;
  }
  return;
}

Assistant:

void borg_sleep_kill(int i)
{
    borg_kill *kill = &borg_kills[i];

    /* Paranoia -- Already wiped */
    if (!kill->r_idx)
        return;

    /* Note */
    borg_note(format("# Noting sleep on a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

    /* note sleep */
    kill->awake = false;

    /* Wipe flow goals */
    borg.goal.type = 0;

    /* Recalculate danger */
    borg_danger_wipe = true;
}